

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O1

Box * libDAI::boundSumProd
                (Box *__return_storage_ptr__,Factor *psi,
                vector<libDAI::Box,_std::allocator<libDAI::Box>_> *incomingBoxes,VarSet *dest,
                bool independent,bool normed)

{
  undefined8 *puVar1;
  VarSet *pVVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  ulong uVar5;
  size_type __n;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> uniqueBoxes;
  Factor prd;
  Prob image_max;
  Prob image_min;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ep_dims;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
  ep;
  Prob image_ep;
  multind ep_index;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> local_258;
  VarSet *local_240;
  size_t local_238;
  uint local_22c;
  Box local_228;
  pointer local_1d0;
  pointer local_1c8;
  Factor *local_1c0;
  Box local_1b8;
  TProb<double> local_160;
  TProb<double> local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
  local_e8;
  TProb<double> local_d0;
  VarSet local_b8;
  multind local_98;
  TFactor<double> local_68;
  
  local_1c0 = psi;
  if ((int)CONCAT71(in_register_00000081,independent) == 0) {
    boundProd(&local_1b8,incomingBoxes);
    if (local_1b8._vars._statespace < 0x11) {
      boundProd(&local_228,incomingBoxes);
      TFactor<double>::TFactor(&local_68,local_1c0);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector(&local_b8._vars,&dest->_vars);
      local_b8._statespace = dest->_statespace;
      Box::boundSumProd(__return_storage_ptr__,&local_228,&local_68,&local_b8,normed);
      if (local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_228._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228._max._p.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228._max._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228._max._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228._min._p.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228._min._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228._min._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228._vars._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_228._vars._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_228._vars._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "# Warning: calculating looser bound in the interest of computation time",0x47);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      Box::Box(__return_storage_ptr__,dest);
    }
    if (local_1b8._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8._max._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8._max._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8._vars._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8._vars._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8._vars._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_238 = CONCAT44(local_238._4_4_,CONCAT31(in_register_00000089,normed));
    local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_240 = dest;
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
              (&local_258,
               ((long)(incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
    if ((incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        if (local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar4 = 0;
        }
        else {
          lVar7 = 0;
          uVar4 = 0;
          do {
            bVar3 = operator==(&(incomingBoxes->
                                super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar5]._vars,
                               (VarSet *)
                               ((long)&((local_258.
                                         super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_vars)._vars.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar7));
            if (bVar3) {
              Box::operator*=((Box *)((long)&((local_258.
                                               super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_vars).
                                             _vars.
                                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar7),
                              (incomingBoxes->
                              super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)._M_impl
                              .super__Vector_impl_data._M_start + uVar5);
              break;
            }
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 0x50;
          } while (uVar4 < (ulong)(((long)local_258.
                                          super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_258.
                                          super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                  -0x3333333333333333));
        }
        if (uVar4 == ((long)local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) {
          std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
                    (&local_258,
                     (incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar5);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(((long)(incomingBoxes->
                                      super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(incomingBoxes->
                                      super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x3333333333333333));
    }
    local_1d0 = local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_1c8 = local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
    __n = ((long)local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_258.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_130,__n,(value_type_conflict2 *)&local_1b8,(allocator_type *)&local_228);
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::vector(&local_e8,__n,(allocator_type *)&local_1b8);
    if (local_1d0 != local_1c8) {
      lVar6 = 0;
      lVar8 = 0;
      lVar7 = 0;
      do {
        Box::extremePoints((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *
                           )&local_228,
                           (Box *)((long)&((local_258.
                                            super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_vars)._vars
                                          .
                                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar8));
        puVar1 = (undefined8 *)
                 ((long)&((local_e8.
                           super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar6);
        local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&((local_e8.
                        super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6);
        puVar1 = (undefined8 *)
                 ((long)&((local_e8.
                           super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar6);
        *puVar1 = local_228._vars._vars.
                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar1[1] = local_228._vars._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&((local_e8.
                   super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6) =
             local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
                  ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                   &local_1b8);
        std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
                  ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                   &local_228);
        local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] =
             (*(long *)((long)&((local_e8.
                                 super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar6) -
              *(long *)((long)&((local_e8.
                                 super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar6) >> 3) *
             -0x5555555555555555;
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x50;
        lVar6 = lVar6 + 0x18;
      } while (__n + (__n == 0) != lVar7);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_100,&local_130);
    multind::multind(&local_98,&local_100);
    pVVar2 = local_240;
    if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7ff0000000000000;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_148._p,pVVar2->_statespace,(value_type_conflict3 *)&local_1b8,
               (allocator_type *)&local_228);
    local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_160._p,pVVar2->_statespace,(value_type_conflict3 *)&local_1b8,
               (allocator_type *)&local_228);
    if (local_98._pdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] != 0) {
      sVar9 = 0;
      local_22c = (uint)(byte)local_238;
      do {
        multind::vi(&local_118,&local_98,sVar9);
        local_238 = sVar9;
        TFactor<double>::TFactor((TFactor<double> *)&local_1b8);
        if (local_1d0 != local_1c8) {
          lVar6 = 0;
          lVar8 = 0;
          lVar7 = 0;
          do {
            TFactor<double>::TFactor
                      ((TFactor<double> *)&local_228,
                       (VarSet *)
                       ((long)&((local_258.
                                 super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->_vars)._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar8),
                       (TProb<double> *)
                       (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar7] * 0x18 +
                       *(long *)((long)&((local_e8.
                                          super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar6)));
            TFactor<double>::operator*=((TFactor<double> *)&local_1b8,(TFactor<double> *)&local_228)
            ;
            if (local_228._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228._min._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_228._min._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_228._min._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228._vars._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_228._vars._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_228._vars._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            lVar7 = lVar7 + 1;
            lVar8 = lVar8 + 0x50;
            lVar6 = lVar6 + 0x18;
          } while (__n + (__n == 0) != lVar7);
        }
        TFactor<double>::operator*=((TFactor<double> *)&local_1b8,local_1c0);
        TFactor<double>::marginal
                  ((TFactor<double> *)&local_228,(TFactor<double> *)&local_1b8,local_240,
                   SUB41(local_22c,0));
        std::vector<double,_std::allocator<double>_>::vector(&local_d0._p,&local_228._min._p);
        sVar9 = local_238;
        if (local_228._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228._min._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_228._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_228._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        min<double>((TProb<double> *)&local_228,&local_d0,&local_148);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_148._p,(vector<double,_std::allocator<double>_> *)&local_228);
        if (local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        max<double>((TProb<double> *)&local_228,&local_d0,&local_160);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_160._p,(vector<double,_std::allocator<double>_> *)&local_228);
        if (local_228._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b8._min._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b8._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_1b8._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b8._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b8._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 < local_98._pdims.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]);
    }
    Box::Box(__return_storage_ptr__,local_240,&local_148,&local_160);
    if (local_160._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_160._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_160._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_148._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_148._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_98._pdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._pdims.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98._pdims.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98._pdims.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._dims.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98._dims.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98._dims.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::~vector(&local_e8);
    if (local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_130.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector(&local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

Box boundSumProd( Factor psi, vector<Box> &incomingBoxes, VarSet dest, bool independent, bool normed ) {
        // Calculates a bounding box for the marginal or partial sum on dest
        // of the product of psi with all incoming boxes.
        //
        // If independent is true, each pair of incoming boxes hould either have
        // identical or disjoint varsets; furthermore, incoming boxes with disjoint
        // varsets are assumed to be independent.
        //
        // Otherwise, there is no restriction on the varsets of incoming boxes and
        // we assume that incoming boxes may be dependent.
        //
        // If normed is true, take the norm after taking the sum-product with psi

        if( independent ) {
            // Multiply together incoming boxes defined on the same variables
            vector<Box> uniqueBoxes;
            uniqueBoxes.reserve( incomingBoxes.size() );
            for( size_t l = 0; l < incomingBoxes.size(); l++ ) {
                size_t k = 0;
                for( k = 0; k < uniqueBoxes.size(); k++ )
                    if( incomingBoxes[l].vars() == uniqueBoxes[k].vars() ) {
                        uniqueBoxes[k] *= incomingBoxes[l];
                        break;
                    }
                if( k == uniqueBoxes.size() )
                    uniqueBoxes.push_back( incomingBoxes[l] );
            }

            // Check that all uniqueBoxes have disjoint sets of variables
            for( size_t l = 0; l < incomingBoxes.size(); l++ )
                for( size_t k = l + 1; k < incomingBoxes.size(); k++ )
                    assert( !(uniqueBoxes[k].vars() && uniqueBoxes[l].vars()) );

            size_t nrBoxes = uniqueBoxes.size();

            // Prepare multi-index to step through the Cartesian products of 
            // the extreme points corresponding to all disjoint varsets in
            // uniqueBoxes
            vector<size_t> ep_dims( nrBoxes, 0 );
            vector<vector<Prob> > ep( nrBoxes );
            for( size_t k = 0; k < nrBoxes; k++ ) {
                ep[k] = uniqueBoxes[k].extremePoints();
                ep_dims[k] = ep[k].size();
            }
            multind ep_index( ep_dims );

            // For each product of extreme points, calculate its image and
            // update the bound
            Prob image_min( dest.stateSpace(), INFINITY );
            Prob image_max( dest.stateSpace(), -INFINITY );
            for( size_t ep_li = 0; ep_li < ep_index.max(); ep_li++ ) {
                // FIXME: this can be sped up massively by caching the indices
                vector<size_t> vi = ep_index.vi( ep_li );
                Factor prd;
                for( size_t k = 0; k < nrBoxes; k++ )
                    prd *= Factor( uniqueBoxes[k].vars(), ep[k][vi[k]] );
                prd *= psi;
                Prob image_ep = prd.marginal(dest,normed).p();
                image_min = min( image_ep, image_min );
                image_max = max( image_ep, image_max );
            }
            return Box( dest, image_min, image_max );
        } else {
            Box prod = boundProd( incomingBoxes );
            if( prod.vars().stateSpace() <= 16 )
                return boundProd( incomingBoxes ).boundSumProd( psi, dest, normed );
            else {
                cout << "# Warning: calculating looser bound in the interest of computation time" << endl;
                return Box( dest );
            }
        }
    }